

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::texture_grad
               (NegativeTestContext *ctx)

{
  ShaderType SVar1;
  NegativeTestContext *pNVar2;
  bool bVar3;
  deBool dVar4;
  RenderContext *pRVar5;
  NotSupportedError *this;
  char *__s;
  DataType in_stack_fffffffffffffb80;
  bool local_31a;
  bool local_301;
  string local_300;
  undefined1 local_2e0 [8];
  string shaderSource_8;
  undefined1 local_2a0 [8];
  string shaderSource_7;
  undefined1 local_260 [8];
  string shaderSource_6;
  undefined1 local_220 [8];
  string shaderSource_5;
  undefined1 local_1e0 [8];
  string shaderSource_4;
  undefined1 local_1a0 [8];
  string shaderSource_3;
  undefined1 local_160 [8];
  string shaderSource_2;
  undefined1 local_120 [8];
  string shaderSource_1;
  undefined1 local_e0 [8];
  string shaderSource;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  int local_78;
  allocator<char> local_71;
  int shaderNdx;
  deUint32 local_50;
  ContextType local_4c;
  byte local_45;
  byte local_32;
  allocator<char> local_31;
  string local_30;
  NegativeTestContext *local_10;
  NegativeTestContext *ctx_local;
  
  local_10 = ctx;
  while( true ) {
    dVar4 = ::deGetFalse();
    pNVar2 = local_10;
    local_32 = 0;
    local_45 = 0;
    local_301 = false;
    if (dVar4 == 0) {
      std::allocator<char>::allocator();
      local_32 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_30,"GL_EXT_texture_cube_map_array",&local_31);
      local_45 = 1;
      bVar3 = NegativeTestContext::isExtensionSupported(pNVar2,&local_30);
      local_31a = true;
      if (!bVar3) {
        pRVar5 = NegativeTestContext::getRenderContext(local_10);
        local_4c.super_ApiType.m_bits = (ApiType)(*pRVar5->_vptr_RenderContext[2])();
        local_50 = (deUint32)glu::ApiType::es(3,2);
        local_31a = glu::contextSupports(local_4c,(ApiType)local_50);
      }
      local_301 = local_31a;
    }
    if ((local_45 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_30);
    }
    if ((local_32 & 1) != 0) {
      std::allocator<char>::~allocator(&local_31);
    }
    if (((local_301 ^ 0xffU) & 1) != 0) break;
    dVar4 = ::deGetFalse();
    pNVar2 = local_10;
    if (dVar4 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&shaderNdx,"textureGrad.",&local_71);
      NegativeTestContext::beginSection(pNVar2,(string *)&shaderNdx);
      std::__cxx11::string::~string((string *)&shaderNdx);
      std::allocator<char>::~allocator(&local_71);
      for (local_78 = 0; local_78 < 6; local_78 = local_78 + 1) {
        bVar3 = NegativeTestContext::isShaderSupported
                          (local_10,*(ShaderType *)
                                     (NegativeTestShared::(anonymous_namespace)::s_shaders +
                                     (long)local_78 * 4));
        pNVar2 = local_10;
        if (bVar3) {
          __s = glu::getShaderTypeName
                          (*(ShaderType *)
                            (NegativeTestShared::(anonymous_namespace)::s_shaders +
                            (long)local_78 * 4));
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b8,__s,
                     (allocator<char> *)(shaderSource.field_2._M_local_buf + 0xf));
          std::operator+(&local_98,"Verify shader: ",&local_b8);
          NegativeTestContext::beginSection(pNVar2,&local_98);
          std::__cxx11::string::~string((string *)&local_98);
          std::__cxx11::string::~string((string *)&local_b8);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(shaderSource.field_2._M_local_buf + 0xf));
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGrad_abi_cxx11_
                    ((string *)local_e0,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                     (long)local_78 * 4),0x2d,TYPE_FLOAT,TYPE_FLOAT_VEC3,
                     TYPE_FLOAT_VEC3,in_stack_fffffffffffffb80);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)
                   (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_78 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_1.field_2._M_local_buf + 8),(string *)local_e0);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_1.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_1.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_e0);
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGrad_abi_cxx11_
                    ((string *)local_120,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                     (long)local_78 * 4),0x2d,TYPE_FLOAT_VEC4,TYPE_FLOAT,
                     TYPE_FLOAT_VEC3,in_stack_fffffffffffffb80);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)
                   (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_78 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_2.field_2._M_local_buf + 8),(string *)local_120);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_2.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_2.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_120);
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGrad_abi_cxx11_
                    ((string *)local_160,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                     (long)local_78 * 4),0x2d,TYPE_FLOAT_VEC4,TYPE_FLOAT_VEC3,
                     TYPE_FLOAT,in_stack_fffffffffffffb80);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)
                   (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_78 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_3.field_2._M_local_buf + 8),(string *)local_160);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_3.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_3.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_160);
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGrad_abi_cxx11_
                    ((string *)local_1a0,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                     (long)local_78 * 4),0x3a,TYPE_FLOAT,TYPE_FLOAT_VEC3,
                     TYPE_FLOAT_VEC3,in_stack_fffffffffffffb80);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)
                   (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_78 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_4.field_2._M_local_buf + 8),(string *)local_1a0);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_4.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_4.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_1a0);
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGrad_abi_cxx11_
                    ((string *)local_1e0,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                     (long)local_78 * 4),0x3a,TYPE_FLOAT_VEC4,TYPE_FLOAT,
                     TYPE_FLOAT_VEC3,in_stack_fffffffffffffb80);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)
                   (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_78 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_5.field_2._M_local_buf + 8),(string *)local_1e0);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_5.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_5.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_1e0);
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGrad_abi_cxx11_
                    ((string *)local_220,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                     (long)local_78 * 4),0x3a,TYPE_FLOAT_VEC4,TYPE_FLOAT_VEC3,
                     TYPE_FLOAT,in_stack_fffffffffffffb80);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)
                   (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_78 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_6.field_2._M_local_buf + 8),(string *)local_220);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_6.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_6.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_220);
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGrad_abi_cxx11_
                    ((string *)local_260,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                     (long)local_78 * 4),0x41,TYPE_FLOAT,TYPE_FLOAT_VEC3,
                     TYPE_FLOAT_VEC3,in_stack_fffffffffffffb80);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)
                   (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_78 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_7.field_2._M_local_buf + 8),(string *)local_260);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_7.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_7.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_260);
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGrad_abi_cxx11_
                    ((string *)local_2a0,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                     (long)local_78 * 4),0x41,TYPE_FLOAT_VEC4,TYPE_FLOAT,
                     TYPE_FLOAT_VEC3,in_stack_fffffffffffffb80);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)
                   (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_78 * 4);
          std::__cxx11::string::string
                    ((string *)(shaderSource_8.field_2._M_local_buf + 8),(string *)local_2a0);
          verifyShader(pNVar2,SVar1,(string *)((long)&shaderSource_8.field_2 + 8));
          std::__cxx11::string::~string((string *)(shaderSource_8.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_2a0);
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGrad_abi_cxx11_
                    ((string *)local_2e0,(_anonymous_namespace_ *)local_10,
                     (NegativeTestContext *)
                     (ulong)*(uint *)(NegativeTestShared::(anonymous_namespace)::s_shaders +
                                     (long)local_78 * 4),0x41,TYPE_FLOAT_VEC4,TYPE_FLOAT_VEC3,
                     TYPE_FLOAT,in_stack_fffffffffffffb80);
          pNVar2 = local_10;
          SVar1 = *(ShaderType *)
                   (NegativeTestShared::(anonymous_namespace)::s_shaders + (long)local_78 * 4);
          std::__cxx11::string::string((string *)&local_300,(string *)local_2e0);
          verifyShader(pNVar2,SVar1,&local_300);
          std::__cxx11::string::~string((string *)&local_300);
          std::__cxx11::string::~string((string *)local_2e0);
          NegativeTestContext::endSection(local_10);
        }
      }
      NegativeTestContext::endSection(local_10);
      return;
    }
  }
  this = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this,"Test requires support for GL_EXT_texture_cube_map_array or version 3.2.",
             "ctx.isExtensionSupported(\"GL_EXT_texture_cube_map_array\") || contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2))"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fNegativeShaderFunctionTests.cpp"
             ,0xc21);
  __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

void texture_grad (NegativeTestContext& ctx)
{
	TCU_CHECK_AND_THROW(NotSupportedError, ctx.isExtensionSupported("GL_EXT_texture_cube_map_array") || contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)), "Test requires support for GL_EXT_texture_cube_map_array or version 3.2.");

	ctx.beginSection("textureGrad.");
	for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
	{
		if (ctx.isShaderSupported(s_shaders[shaderNdx]))
		{
			ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
			{
				const std::string shaderSource(genShaderSourceTextureGrad(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT, glu::TYPE_FLOAT_VEC3, glu::TYPE_FLOAT_VEC3));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGrad(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT_VEC4, glu::TYPE_FLOAT, glu::TYPE_FLOAT_VEC3));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGrad(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT_VEC4, glu::TYPE_FLOAT_VEC3, glu::TYPE_FLOAT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGrad(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT, glu::TYPE_FLOAT_VEC3, glu::TYPE_FLOAT_VEC3));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGrad(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT_VEC4, glu::TYPE_FLOAT, glu::TYPE_FLOAT_VEC3));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGrad(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT_VEC4, glu::TYPE_FLOAT_VEC3, glu::TYPE_FLOAT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGrad(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT, glu::TYPE_FLOAT_VEC3, glu::TYPE_FLOAT_VEC3));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGrad(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT_VEC4, glu::TYPE_FLOAT, glu::TYPE_FLOAT_VEC3));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGrad(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE_ARRAY, glu::TYPE_FLOAT_VEC4, glu::TYPE_FLOAT_VEC3, glu::TYPE_FLOAT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			ctx.endSection();
		}
	}
	ctx.endSection();
}